

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool __thiscall
ON_V5ExtrusionDisplayMeshCache::Write
          (ON_V5ExtrusionDisplayMeshCache *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  element_type *this_00;
  ON_Mesh *local_60;
  byte local_51;
  ON_Mesh *mesh;
  size_t i;
  ON_Mesh *meshes [3];
  bool bSaveMeshes;
  bool rc;
  ON_BinaryArchive *binary_archive_local;
  ON_V5ExtrusionDisplayMeshCache *this_local;
  
  meshes[2]._7_1_ = 1;
  meshes[2]._6_1_ = ON_BinaryArchive::Save3dmRenderMesh(binary_archive,extrusion_object);
  this_00 = std::__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(this->m_render_mesh).
                        super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>);
  meshes[0] = std::__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                        (&(this->m_analysis_mesh).
                          super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>);
  meshes[1] = (ON_Mesh *)0x0;
  if (this_00 != (element_type *)0x0) {
    ON_Mesh::IsEmpty(this_00);
  }
  if ((meshes[0] != (ON_Mesh *)0x0) && (bVar1 = ON_Mesh::IsEmpty(meshes[0]), bVar1)) {
    meshes[0] = (ON_Mesh *)0x0;
  }
  mesh = (ON_Mesh *)0x0;
  while( true ) {
    local_51 = 0;
    if (mesh < (ON_Mesh *)0x3) {
      local_51 = meshes[2]._7_1_;
    }
    if ((local_51 & 1) == 0) break;
    if ((meshes[2]._6_1_ & 1) == 0) {
      local_60 = (ON_Mesh *)0x0;
    }
    else {
      local_60 = meshes[(long)((long)&mesh[-1].m_partition + 7)];
    }
    meshes[2]._7_1_ = ON_BinaryArchive::WriteObject(binary_archive,(ON_Object *)local_60);
    mesh = (ON_Mesh *)((long)&(mesh->super_ON_Geometry).super_ON_Object._vptr_ON_Object + 1);
  }
  return (bool)(meshes[2]._7_1_ & 1);
}

Assistant:

bool ON_V5ExtrusionDisplayMeshCache::Write(ON_BinaryArchive& binary_archive) const
{
  bool rc = true;
  bool bSaveMeshes = binary_archive.Save3dmRenderMesh(ON::extrusion_object);
  const ON_Mesh* meshes[3] = { m_render_mesh.get(), m_analysis_mesh.get(), nullptr };
  if (nullptr != meshes[0] && meshes[0]->IsEmpty())
    meshes[0] = nullptr;
  if (nullptr != meshes[1] && meshes[1]->IsEmpty())
    meshes[1] = nullptr;
  for(size_t i = 0; i < sizeof(meshes)/sizeof(meshes[0]) && rc; i++ )
  {
    const ON_Mesh* mesh = bSaveMeshes ? meshes[i] : nullptr;
    rc = binary_archive.WriteObject(mesh);
  }
  return rc;
}